

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O0

void re2::SearchBitState(int iters,char *regexp,StringPiece *text,Anchor anchor,bool expect_match)

{
  Prog *pPVar1;
  bool bVar2;
  ostream *poVar3;
  LogMessage local_4e0;
  LogMessage local_360;
  Prog *local_1e0;
  Prog *prog;
  LogMessage local_1c8;
  StringPiece local_48;
  Regexp *local_38;
  Regexp *re;
  byte local_25;
  int i;
  bool expect_match_local;
  StringPiece *pSStack_20;
  Anchor anchor_local;
  StringPiece *text_local;
  char *regexp_local;
  int iters_local;
  
  local_25 = expect_match;
  i = anchor;
  pSStack_20 = text;
  text_local = (StringPiece *)regexp;
  regexp_local._4_4_ = iters;
  for (re._4_4_ = 0; re._4_4_ < regexp_local._4_4_; re._4_4_ = re._4_4_ + 1) {
    StringPiece::StringPiece(&local_48,(char *)text_local);
    local_38 = Regexp::Parse(&local_48,LikePerl,(RegexpStatus *)0x0);
    if (local_38 == (Regexp *)0x0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x39d);
      poVar3 = LogMessage::stream(&local_1c8);
      std::operator<<(poVar3,"Check failed: re");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1c8);
    }
    local_1e0 = Regexp::CompileToProg(local_38,0);
    if (local_1e0 == (Prog *)0x0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_360,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x39f);
      poVar3 = LogMessage::stream(&local_360);
      std::operator<<(poVar3,"Check failed: prog");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_360);
    }
    bVar2 = Prog::SearchBitState(local_1e0,pSStack_20,pSStack_20,i,kFirstMatch,(StringPiece *)0x0,0)
    ;
    if (bVar2 != (bool)(local_25 & 1)) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_4e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x3a1);
      poVar3 = LogMessage::stream(&local_4e0);
      std::operator<<(poVar3,
                      "Check failed: (prog->SearchBitState(text, text, anchor, Prog::kFirstMatch, __null, 0)) == (expect_match)"
                     );
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_4e0);
    }
    pPVar1 = local_1e0;
    if (local_1e0 != (Prog *)0x0) {
      Prog::~Prog(local_1e0);
      operator_delete(pPVar1);
    }
    Regexp::Decref(local_38);
  }
  return;
}

Assistant:

void SearchBitState(int iters, const char* regexp, const StringPiece& text,
            Prog::Anchor anchor, bool expect_match) {
  for (int i = 0; i < iters; i++) {
    Regexp* re = Regexp::Parse(regexp, Regexp::LikePerl, NULL);
    CHECK(re);
    Prog* prog = re->CompileToProg(0);
    CHECK(prog);
    CHECK_EQ(prog->SearchBitState(text, text, anchor, Prog::kFirstMatch, NULL, 0),
             expect_match);
    delete prog;
    re->Decref();
  }
}